

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O2

void tab_to_next_widget_proc(Am_Object *cmd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object cur_inter;
  Am_Object next_widget;
  Am_Object cur_widget;
  Am_Object last_widget;
  Am_Object inter;
  Am_Value_List all_text_widgets;
  Am_Object cur_text;
  Am_Value v;
  Am_Object local_80;
  Am_String cur_cur_value;
  Am_String old_cur_value;
  Am_Input_Char ic;
  Am_Object local_60;
  Am_Value local_58;
  Am_Value local_48;
  Am_Object local_38;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  bVar1 = Am_Object::Valid(&inter);
  if (!bVar1) goto LAB_0025d9b7;
  pAVar4 = Am_Object::Get(&inter,0x1a9,0);
  Am_Value_List::Am_Value_List(&all_text_widgets,pAVar4);
  last_widget.data = (Am_Object_Data *)0x0;
  cur_widget.data = (Am_Object_Data *)0x0;
  next_widget.data = (Am_Object_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Value_List::Empty(&all_text_widgets);
  if (!bVar1) {
    pAVar4 = Am_Object::Get(cmd,0x1d8,1);
    Am_Value::operator=(&v,pAVar4);
    bVar1 = Am_Value::Valid(&v);
    if (bVar1) {
      Am_Object::operator=(&last_widget,&v);
    }
    Am_Object::Get_Owner(&cur_inter,(Am_Slot_Flags)cmd);
    Am_Object::operator=(&inter,&cur_inter);
    Am_Object::~Am_Object(&cur_inter);
    pAVar4 = Am_Object::Get(&inter,0x11b,0);
    Am_Input_Char::Am_Input_Char(&ic,pAVar4);
    Am_Value_List::Start(&all_text_widgets);
    while( true ) {
      bVar1 = Am_Value_List::Last(&all_text_widgets);
      if (bVar1) break;
      pAVar4 = Am_Value_List::Get(&all_text_widgets);
      Am_Object::operator=(&cur_widget,pAVar4);
      Am_Object::Get_Object(&cur_inter,(Am_Slot_Key)&cur_widget,0x1ac);
      Am_Object::operator=(&inter,&cur_inter);
      Am_Object::~Am_Object(&cur_inter);
      pAVar4 = Am_Object::Get(&inter,0x123,1);
      Am_Value::operator=(&v,pAVar4);
      bVar2 = Am_Value::Valid(&v);
      if (bVar2) {
        iVar3 = Am_Value::operator_cast_to_int(&v);
        if (iVar3 == 1) {
          get_next_from((Am_Value_List *)&cur_inter,SUB81(&all_text_widgets,0));
          Am_Object::operator=(&next_widget,&cur_inter);
          Am_Object::~Am_Object(&cur_inter);
          break;
        }
      }
      Am_Value_List::Next(&all_text_widgets);
    }
    bVar2 = Am_Object::Valid(&next_widget);
    if (!bVar2) {
      bVar2 = Am_Object::Valid(&last_widget);
      if (bVar2) {
        Am_Value_List::Start(&all_text_widgets);
        pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&last_widget);
        bVar2 = Am_Value_List::Member(&all_text_widgets,pAVar5);
        if (bVar2) {
          get_next_from((Am_Value_List *)&cur_inter,SUB81(&all_text_widgets,0));
          Am_Object::operator=(&next_widget,&cur_inter);
          Am_Object::~Am_Object(&cur_inter);
        }
      }
      bVar2 = Am_Object::Valid(&next_widget);
      if (!bVar2) {
        Am_Value_List::Start(&all_text_widgets);
        pAVar4 = Am_Value_List::Get(&all_text_widgets);
        Am_Object::operator=(&next_widget,pAVar4);
      }
    }
    if (bVar1) {
LAB_0025d898:
      bVar1 = Am_Object::Valid(&last_widget);
      if (bVar1) {
        Am_Object::Set(&last_widget,0x17c,false,0);
      }
      bVar1 = Am_Object::Valid(&next_widget);
      if (bVar1) {
        find_next_active_widget(&cur_inter,(Am_Value_List *)&next_widget);
        Am_Object::operator=(&next_widget,&cur_inter);
        Am_Object::~Am_Object(&cur_inter);
        bVar1 = Am_Object::Valid(&next_widget);
        if (bVar1) {
          pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&next_widget);
          Am_Object::Set(cmd,0x1d8,pAVar5,1);
          Am_Object::Set(&next_widget,0x17c,true,0);
          Am_Object::Am_Object(&local_80,&next_widget);
          Am_Value::Am_Value(&local_58,&Am_No_Value);
          Am_Start_Widget(&local_80,&local_58);
          Am_Value::~Am_Value(&local_58);
          pAVar6 = &local_80;
          goto LAB_0025d980;
        }
      }
    }
    else {
      Am_Object::Get_Object(&cur_inter,(Am_Slot_Key)&cur_widget,0x1ac);
      Am_Object::Get_Object(&cur_text,(Am_Slot_Key)&cur_widget,0x1d7);
      bVar1 = check_value_legal(&cur_text,&cur_inter);
      if (bVar1) {
        pAVar4 = Am_Object::Get(&cur_inter,0x16c,0);
        Am_String::Am_String(&old_cur_value,pAVar4);
        pAVar4 = Am_Object::Get(&cur_text,0xab,0);
        Am_String::Am_String(&cur_cur_value,pAVar4);
        bVar1 = Am_String::operator==(&old_cur_value,&cur_cur_value);
        if (bVar1) {
          pAVar6 = &local_38;
          Am_Object::Am_Object(pAVar6,&inter);
          Am_Abort_Interactor(pAVar6,true);
        }
        else {
          Am_Object::Am_Object(&local_60,&cur_widget);
          Am_Value::Am_Value(&local_48,&Am_No_Value);
          pAVar6 = &local_60;
          Am_Stop_Widget(pAVar6,&local_48);
          Am_Value::~Am_Value(&local_48);
        }
        Am_Object::~Am_Object(pAVar6);
        Am_Object::Set(&cur_widget,0x17c,false,0);
        Am_String::~Am_String(&cur_cur_value);
        Am_String::~Am_String(&old_cur_value);
        Am_Object::~Am_Object(&cur_text);
        Am_Object::~Am_Object(&cur_inter);
        goto LAB_0025d898;
      }
      Am_Object::~Am_Object(&cur_text);
      pAVar6 = &cur_inter;
LAB_0025d980:
      Am_Object::~Am_Object(pAVar6);
    }
  }
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&next_widget);
  Am_Object::~Am_Object(&cur_widget);
  Am_Object::~Am_Object(&last_widget);
  Am_Value_List::~Am_Value_List(&all_text_widgets);
LAB_0025d9b7:
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, tab_to_next_widget, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  if (inter.Valid()) {
    Am_Value_List all_text_widgets = inter.Get(Am_LIST_OF_TEXT_WIDGETS);
    Am_Object last_widget, cur_widget, next_widget;
    bool forward;
    bool running = false;
    Am_Value v;
    if (all_text_widgets.Empty())
      return; //nothing to do
    v = cmd.Peek(Am_LAST_TEXT_WIDGET);
    if (v.Valid())
      last_widget = v;
    // see if going forward or backwards
    inter = cmd.Get_Owner();
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    //go forward if not shifted
    forward = !ic.shift;
    // search to see which part is active, if any
    for (all_text_widgets.Start(); !all_text_widgets.Last();
         all_text_widgets.Next()) {
      cur_widget = all_text_widgets.Get();
      inter = cur_widget.Get_Object(Am_INTERACTOR);
      v = inter.Peek(Am_CURRENT_STATE);
      if (v.Valid() && (int)v == 1) { //then this is it
        running = true;
        next_widget = get_next_from(all_text_widgets, forward);
        break;
      }
    }
    if (!next_widget.Valid()) {
      //nothing running, see if have current
      if (last_widget.Valid()) {
        all_text_widgets.Start();
        if (all_text_widgets.Member(last_widget)) {
          next_widget = get_next_from(all_text_widgets, forward);
        }
      }
      if (!next_widget.Valid()) // just use first in the list
      {
        all_text_widgets.Start();
        next_widget = all_text_widgets.Get();
      }
    }
    if (running) {
      //check to see whether current value is legal and if not, don't go on
      Am_Object cur_inter = cur_widget.Get_Object(Am_INTERACTOR);
      Am_Object cur_text = cur_widget.Get_Object(Am_TEXT_WIDGET_TEXT_OBJ);
      if (!check_value_legal(cur_text, cur_inter))
        return;
      //check if old value same as current, in which case, abort so
      //command not queued for undo
      Am_String old_cur_value = cur_inter.Get(Am_OLD_VALUE);
      Am_String cur_cur_value = cur_text.Get(Am_TEXT);
      if (old_cur_value == cur_cur_value)
        Am_Abort_Interactor(inter);
      else
        Am_Stop_Widget(cur_widget);

      cur_widget.Set(Am_KEY_SELECTED, false);
    }
    if (last_widget.Valid())
      last_widget.Set(Am_KEY_SELECTED, false);

    if (next_widget.Valid()) {
      next_widget = find_next_active_widget(next_widget, all_text_widgets);
      if (next_widget.Valid()) {
        cmd.Set(Am_LAST_TEXT_WIDGET, next_widget, Am_OK_IF_NOT_THERE);
        next_widget.Set(Am_KEY_SELECTED, true);
        Am_Start_Widget(next_widget);
      }
    }
  }
}